

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_isarray(jit_State *J,RecordFFData *rd)

{
  IROpT IVar1;
  TRef TVar2;
  int iVar3;
  TRef TVar4;
  TRef tr0;
  int isarr;
  GCtab *t;
  TRef trres;
  TRef src;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  if ((*J->base & 0x1f000000) == 0xb000000) {
    TVar2 = lj_ir_call(J,IRCALL_lj_tab_isarray,(ulong)*J->base);
    iVar3 = lj_tab_isarray((GCtab *)(rd->argv->u64 & 0x7fffffffffff));
    TVar4 = lj_ir_kint(J,0);
    IVar1 = 0x893;
    if (iVar3 != 0) {
      IVar1 = 0x993;
    }
    (J->fold).ins.field_0.ot = IVar1;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    TVar2 = 0x1007ffe;
    if (iVar3 != 0) {
      TVar2 = 0x2007ffd;
    }
    *J->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_isarray(jit_State *J, RecordFFData *rd)
{
  TRef src = J->base[0];
  if (LJ_LIKELY(tref_istab(src))) {
    TRef trres = lj_ir_call(J, IRCALL_lj_tab_isarray, src);
    GCtab *t = tabV(&rd->argv[0]);
    int isarr = lj_tab_isarray(t);
    TRef tr0 = lj_ir_kint(J, 0);
    emitir(isarr ? IRTGI(IR_NE) : IRTGI(IR_EQ), trres, tr0);
    J->base[0] = isarr ? TREF_TRUE : TREF_FALSE;
  }  /* else: Interpreter will throw. */
}